

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O2

void __thiscall wasm::ModuleUtils::anon_unknown_4::TypeInfos::note(TypeInfos *this,Type type)

{
  Type TVar1;
  Type local_40;
  Type type_local;
  pointer local_30;
  
  local_40.id = type.id;
  wasm::Type::getHeapTypeChildren
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&type_local,&local_40);
  for (TVar1 = type_local; (pointer)TVar1.id != local_30; TVar1.id = TVar1.id + 8) {
    note(this,(HeapType)((pointer)TVar1.id)->id);
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&type_local);
  return;
}

Assistant:

void note(Type type) {
    for (HeapType ht : type.getHeapTypeChildren()) {
      note(ht);
    }
  }